

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cpp
# Opt level: O2

bool slang::svGlobMatchesInternal(string_view path,string_view pattern)

{
  bool bVar1;
  string_view sVar2;
  string_view pattern_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view path_local;
  string_view local_40;
  
  path_local._M_str = path._M_str;
  path_local._M_len = path._M_len;
  local_40._M_len = pattern._M_len;
  sVar2 = pattern;
  while( true ) {
    local_40 = sVar2;
    bVar1 = local_40._M_len == 0;
    if ((bVar1) || (path_local._M_len == 0)) {
      nextSegment(&path_local);
      if (local_40._M_len != 0) {
        return false;
      }
      return path_local._M_len == 0;
    }
    __x._M_str = "...";
    __x._M_len = 3;
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with(&local_40,__x);
    if (bVar1) {
      local_40 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (&local_40,3,0xffffffffffffffff);
      do {
        sVar2._M_str = path_local._M_str;
        sVar2._M_len = path_local._M_len;
        bVar1 = svGlobMatchesInternal(sVar2,local_40);
        if (bVar1) {
          return bVar1;
        }
        nextSegment(&path_local);
      } while (path_local._M_len != 0);
      return bVar1;
    }
    sVar2 = nextSegment(&path_local);
    pattern_00 = nextSegment(&local_40);
    bVar1 = matches(sVar2,pattern_00);
    if (!bVar1) break;
    sVar2 = local_40;
  }
  return false;
}

Assistant:

static bool svGlobMatchesInternal(std::string_view path, std::string_view pattern) {
    while (!pattern.empty() && !path.empty()) {
        // Special case for recursive directory search.
        if (pattern.starts_with("..."sv)) {
            pattern = pattern.substr(3);
            do {
                if (svGlobMatchesInternal(path, pattern))
                    return true;

                nextSegment(path);
            } while (!path.empty());

            return false;
        }

        // If the next segments don't match then we don't match overall.
        if (!matches(nextSegment(path), nextSegment(pattern))) {
            return false;
        }
    }

    // We match if:
    // 1) we used up the whole pattern
    // 2) pattern ended in a separator and the next path segment is the last (i.e. the file name)
    //    -- OR --
    //    pattern didn't end in a separator and we matched the whole path (so it's empty now)
    nextSegment(path);
    return pattern.empty() && path.empty();
}